

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddLdFldInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionInfo *inlinee)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Type TVar5;
  undefined4 *puVar6;
  FunctionBody *pFVar7;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> **ppWVar8;
  Recycler *pRVar9;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *ptr;
  FunctionCodeGenJitTimeData *ptr_00;
  FunctionCodeGenJitTimeData **ppFVar10;
  FunctionCodeGenJitTimeData *inlineeData;
  TrackAllocData local_58;
  FunctionBody *local_30;
  FunctionBody *functionBody;
  FunctionInfo *inlinee_local;
  Recycler *pRStack_18;
  InlineCacheIndex inlineCacheIndex_local;
  Recycler *recycler_local;
  FunctionCodeGenJitTimeData *this_local;
  
  functionBody = (FunctionBody *)inlinee;
  inlinee_local._4_4_ = inlineCacheIndex;
  pRStack_18 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa5,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_30 = GetFunctionBody(this);
  if (local_30 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa7,"(functionBody)","functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar2 = inlinee_local._4_4_;
  pFVar7 = GetFunctionBody(this);
  uVar4 = FunctionBody::GetInlineCacheCount(pFVar7);
  if (uVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa8,
                                "(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount())",
                                "inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa9,"(inlinee)","inlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->ldFldInlinees);
  pRVar9 = pRStack_18;
  if (*ppWVar8 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    pFVar7 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar7);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo,0,
               (ulong)uVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
               ,0xad);
    pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_58);
    pFVar7 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar7);
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                    ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::operator=
              (&this->ldFldInlinees,ptr);
  }
  ptr_00 = New(pRStack_18,(FunctionInfo *)functionBody,(EntryPointInfo *)0x0,true);
  ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->ldFldInlinees);
  ppFVar10 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenJitTimeData__
                       ((WriteBarrierPtr *)(*ppWVar8 + inlinee_local._4_4_));
  if (*ppFVar10 != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xb1,"(!ldFldInlinees[inlineCacheIndex])",
                                "!ldFldInlinees[inlineCacheIndex]");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->ldFldInlinees);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=
            (*ppWVar8 + inlinee_local._4_4_,ptr_00);
  TVar5 = this->ldFldInlineeCount + 1;
  this->ldFldInlineeCount = TVar5;
  if (TVar5 == 0) {
    Throw::OutOfMemory();
  }
  return ptr_00;
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionInfo *const inlinee)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData*), GetFunctionBody()->GetInlineCacheCount());
        }

        const auto inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr);
        Assert(!ldFldInlinees[inlineCacheIndex]);
        ldFldInlinees[inlineCacheIndex] = inlineeData;
        if (++ldFldInlineeCount == 0)
        {
            Js::Throw::OutOfMemory();
        }
        return inlineeData;
    }